

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O0

void Omega_h::binary::write_tag(ostream *stream,TagBase *tag,bool is_compressed,bool needs_swapping)

{
  bool bVar1;
  Int IVar2;
  int iVar3;
  string *psVar4;
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined1 local_60 [26];
  I8 type;
  I8 ncomps;
  string local_40 [8];
  string name;
  bool needs_swapping_local;
  bool is_compressed_local;
  TagBase *tag_local;
  ostream *stream_local;
  
  psVar4 = TagBase::name_abi_cxx11_(tag);
  std::__cxx11::string::string(local_40,(string *)psVar4);
  write((int)stream,local_40,(ulong)(needs_swapping & 1));
  IVar2 = TagBase::ncomps(tag);
  local_60[0x13] = (char)IVar2;
  write_value<signed_char>(stream,local_60[0x13],needs_swapping);
  iVar3 = (*tag->_vptr_TagBase[2])();
  local_60[0x12] = (char)iVar3;
  write_value<signed_char>(stream,local_60[0x12],needs_swapping);
  bVar1 = is<signed_char>(tag);
  if (bVar1) {
    as<signed_char>(tag);
    Tag<signed_char>::array((Tag<signed_char> *)local_60);
    write_array<signed_char>(stream,(Read<signed_char> *)local_60,is_compressed,needs_swapping);
    Read<signed_char>::~Read((Read<signed_char> *)local_60);
  }
  else {
    bVar1 = is<int>(tag);
    if (bVar1) {
      as<int>(tag);
      Tag<int>::array((Tag<int> *)local_70);
      write_array<int>(stream,(Read<int> *)local_70,is_compressed,needs_swapping);
      Read<int>::~Read((Read<int> *)local_70);
    }
    else {
      bVar1 = is<long>(tag);
      if (bVar1) {
        as<long>(tag);
        Tag<long>::array((Tag<long> *)local_80);
        write_array<long>(stream,(Read<long> *)local_80,is_compressed,needs_swapping);
        Read<long>::~Read((Read<long> *)local_80);
      }
      else {
        bVar1 = is<double>(tag);
        if (!bVar1) {
          fail("unexpected tag type in binary write\n");
        }
        as<double>(tag);
        Tag<double>::array((Tag<double> *)local_90);
        write_array<double>(stream,(Read<double> *)local_90,is_compressed,needs_swapping);
        Read<double>::~Read((Read<double> *)local_90);
      }
    }
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

static void write_tag(std::ostream& stream, TagBase const* tag,
    bool is_compressed, bool needs_swapping) {
  std::string name = tag->name();
  write(stream, name, needs_swapping);
  auto ncomps = I8(tag->ncomps());
  write_value(stream, ncomps, needs_swapping);
  I8 type = tag->type();
  write_value(stream, type, needs_swapping);
  if (is<I8>(tag)) {
    write_array(stream, as<I8>(tag)->array(), is_compressed, needs_swapping);
  } else if (is<I32>(tag)) {
    write_array(stream, as<I32>(tag)->array(), is_compressed, needs_swapping);
  } else if (is<I64>(tag)) {
    write_array(stream, as<I64>(tag)->array(), is_compressed, needs_swapping);
  } else if (is<Real>(tag)) {
    write_array(stream, as<Real>(tag)->array(), is_compressed, needs_swapping);
  } else {
    Omega_h_fail("unexpected tag type in binary write\n");
  }
}